

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

bool FIX::Message::isTrailerField(int field,DataDictionary *pD)

{
  bool bVar1;
  
  bVar1 = true;
  if (((field != 10) && (field != 0x59)) && (field != 0x5d)) {
    if (pD != (DataDictionary *)0x0) {
      bVar1 = DataDictionary::isTrailerField(pD,field);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Message::isTrailerField(int field, const DataDictionary *pD) {
  if (isTrailerField(field)) {
    return true;
  }
  if (pD) {
    return pD->isTrailerField(field);
  }
  return false;
}